

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::createForLoopNode
          (Parser *this,Token *t,Node *optional_initialization,Node *optional_expression,
          Node *optional_increment,Node *loop_body)

{
  Node *this_00;
  vector<Node_*,_std::allocator<Node_*>_> *this_01;
  Node *loop_body_local;
  Node *optional_increment_local;
  Node *optional_expression_local;
  Node *optional_initialization_local;
  
  loop_body_local = loop_body;
  optional_increment_local = optional_increment;
  optional_expression_local = optional_expression;
  optional_initialization_local = optional_initialization;
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,this->ctx,t);
  this_00->nodeType = PNT_FOR_LOOP;
  this_01 = &this_00->children;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&optional_initialization_local);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&optional_expression_local);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&optional_increment_local);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&loop_body_local);
  return this_00;
}

Assistant:

Node * createForLoopNode(Token & t, Node * optional_initialization, Node * optional_expression,
    Node * optional_increment, Node * loop_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FOR_LOOP;
    n->children.push_back(optional_initialization);
    n->children.push_back(optional_expression);
    n->children.push_back(optional_increment);
    n->children.push_back(loop_body);
    return n;
  }